

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_between_face_area(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,char *msg)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_INT RVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  REF_GEOM pRVar9;
  REF_INT sense;
  REF_DBL uv [2];
  REF_INT ncell;
  REF_INT id;
  REF_DBL uv_area30;
  REF_DBL uv_area21;
  REF_DBL uv_area20;
  REF_DBL uv_area3;
  REF_DBL uv_area2;
  REF_INT cells [2];
  REF_DBL uv_area_sign;
  REF_INT nodes3 [27];
  REF_INT nodes2 [27];
  REF_INT local_1c4;
  REF_GEOM local_1c0;
  REF_INT local_1b4;
  REF_CELL local_1b0;
  REF_DBL local_1a8;
  undefined8 local_1a0;
  double local_198;
  int local_190;
  REF_INT local_18c;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  REF_INT local_138;
  REF_INT local_134;
  char *local_130;
  double local_128;
  double local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->cell[3];
  pRVar9 = ref_grid->geom;
  local_1b4 = node1;
  local_130 = msg;
  uVar4 = ref_geom_unique_id(pRVar9,new_node,2,&local_18c);
  if (uVar4 == 0) {
    local_1c0 = pRVar9;
    local_1b0 = pRVar2;
    uVar4 = ref_geom_uv_area_sign(ref_grid,local_18c,&local_120);
    RVar3 = local_1b4;
    if (uVar4 == 0) {
      uVar4 = ref_cell_list_with2(local_1b0,node0,local_1b4,2,&local_190,&local_138);
      pRVar2 = local_1b0;
      if (uVar4 == 0) {
        if ((long)local_190 != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3ed,"ref_geom_between_face_area","expected two tri for box2 nodes",2,
                 (long)local_190);
          return 1;
        }
        uVar4 = ref_cell_nodes(local_1b0,local_138,local_a8);
        if (uVar4 == 0) {
          uVar4 = ref_cell_nodes(pRVar2,local_134,local_118);
          pRVar9 = local_1c0;
          if (uVar4 == 0) {
            uVar4 = ref_geom_uv_area(local_1c0,local_a8,&local_140);
            if (uVar4 == 0) {
              local_198 = local_120;
              local_168 = local_140 * local_120;
              local_140 = local_168;
              uVar4 = ref_geom_uv_area(pRVar9,local_118,&local_148);
              if (uVar4 == 0) {
                local_170 = local_148 * local_198;
                iVar1 = local_1b0->node_per;
                if (0 < (long)iVar1) {
                  uVar5 = 0;
                  do {
                    if (local_a8[uVar5] == node0) {
                      local_a8[uVar5] = new_node;
                    }
                    uVar5 = uVar5 + 1;
                  } while (uVar5 < (ulong)(long)iVar1);
                }
                local_148 = local_170;
                uVar4 = ref_geom_uv_area(pRVar9,local_a8,&local_150);
                if (uVar4 == 0) {
                  local_178 = local_150 * local_198;
                  iVar1 = local_1b0->node_per;
                  uVar5 = (ulong)iVar1;
                  if (0 < (long)uVar5) {
                    uVar6 = 0;
                    do {
                      if (local_a8[uVar6] == new_node) {
                        local_a8[uVar6] = node0;
                      }
                      uVar6 = uVar6 + 1;
                    } while (uVar6 < uVar5);
                    if (0 < iVar1) {
                      uVar6 = 0;
                      do {
                        if (local_a8[uVar6] == RVar3) {
                          local_a8[uVar6] = new_node;
                        }
                        uVar6 = uVar6 + 1;
                      } while (uVar6 < uVar5);
                    }
                  }
                  local_150 = local_178;
                  uVar4 = ref_geom_uv_area(pRVar9,local_a8,&local_158);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0x3fe,"ref_geom_between_face_area",(ulong)uVar4,"uv area 2 node 1");
                    return uVar4;
                  }
                  local_180 = local_158 * local_198;
                  iVar1 = local_1b0->node_per;
                  uVar5 = (ulong)iVar1;
                  if (0 < (long)uVar5) {
                    uVar6 = 0;
                    do {
                      if (local_a8[uVar6] == new_node) {
                        local_a8[uVar6] = RVar3;
                      }
                      uVar6 = uVar6 + 1;
                    } while (uVar6 < uVar5);
                    pRVar9 = local_1c0;
                    if (0 < iVar1) {
                      uVar6 = 0;
                      do {
                        if (local_118[uVar6] == node0) {
                          local_118[uVar6] = new_node;
                        }
                        uVar6 = uVar6 + 1;
                      } while (uVar6 < uVar5);
                    }
                  }
                  local_158 = local_180;
                  uVar4 = ref_geom_uv_area(pRVar9,local_118,&local_160);
                  if (uVar4 == 0) {
                    local_188 = local_160 * local_198;
                    iVar1 = local_1b0->node_per;
                    uVar5 = (ulong)iVar1;
                    if (0 < (long)uVar5) {
                      uVar6 = 0;
                      do {
                        if (local_118[uVar6] == new_node) {
                          local_118[uVar6] = node0;
                        }
                        uVar6 = uVar6 + 1;
                      } while (uVar6 < uVar5);
                      if (0 < iVar1) {
                        uVar6 = 0;
                        do {
                          if (local_118[uVar6] == local_1b4) {
                            local_118[uVar6] = new_node;
                          }
                          uVar6 = uVar6 + 1;
                        } while (uVar6 < uVar5);
                      }
                    }
                    local_160 = local_188;
                    uVar4 = ref_geom_uv_area(local_1c0,local_118,&local_128);
                    if (uVar4 == 0) {
                      iVar1 = local_1b0->node_per;
                      if (0 < (long)iVar1) {
                        uVar5 = 0;
                        do {
                          if (local_118[uVar5] == new_node) {
                            local_118[uVar5] = local_1b4;
                          }
                          uVar5 = uVar5 + 1;
                        } while (uVar5 < (ulong)(long)iVar1);
                      }
                      local_198 = local_198 * local_128;
                      if ((((1e-20 < local_168) && (1e-20 < local_170)) && (0.0 < local_178)) &&
                         (((0.0 < local_180 && (0.0 < local_188)) && (0.0 < local_198)))) {
                        return 0;
                      }
                      printf("%s orig uv area %e %e new %e %e %e %e\n",local_168,local_170,local_178
                             ,local_180,local_188,local_198,local_130);
                      iVar1 = local_1b0->node_per;
                      if (0 < (long)iVar1) {
                        uVar5 = 0;
                        do {
                          if (local_a8[uVar5] == node0) {
                            local_a8[uVar5] = new_node;
                          }
                          uVar5 = uVar5 + 1;
                        } while (uVar5 < (ulong)(long)iVar1);
                      }
                      uVar4 = ref_geom_cell_tuv(local_1c0,local_a8[0],local_a8,2,&local_1a8,
                                                &local_1c4);
                      if (uVar4 == 0) {
                        printf("20uv %.18e %.18e\n",local_1a8,local_1a0);
                        uVar4 = ref_geom_cell_tuv(local_1c0,local_a8[1],local_a8,2,&local_1a8,
                                                  &local_1c4);
                        if (uVar4 == 0) {
                          printf("20uv %.18e %.18e\n",local_1a8,local_1a0);
                          uVar4 = ref_geom_cell_tuv(local_1c0,local_a8[2],local_a8,2,&local_1a8,
                                                    &local_1c4);
                          if (uVar4 == 0) {
                            printf("20uv %.18e %.18e\n",local_1a8,local_1a0);
                            iVar1 = local_1b0->node_per;
                            uVar5 = (ulong)iVar1;
                            if (0 < (long)uVar5) {
                              uVar6 = 0;
                              do {
                                if (local_a8[uVar6] == new_node) {
                                  local_a8[uVar6] = node0;
                                }
                                uVar6 = uVar6 + 1;
                              } while (uVar6 < uVar5);
                              if (0 < iVar1) {
                                uVar6 = 0;
                                do {
                                  if (local_a8[uVar6] == local_1b4) {
                                    local_a8[uVar6] = new_node;
                                  }
                                  uVar6 = uVar6 + 1;
                                } while (uVar6 < uVar5);
                              }
                            }
                            uVar4 = ref_geom_cell_tuv(local_1c0,local_a8[0],local_a8,2,&local_1a8,
                                                      &local_1c4);
                            if (uVar4 == 0) {
                              printf("21uv %.18e %.18e\n",local_1a8,local_1a0);
                              uVar4 = ref_geom_cell_tuv(local_1c0,local_a8[1],local_a8,2,&local_1a8,
                                                        &local_1c4);
                              if (uVar4 == 0) {
                                printf("21uv %.18e %.18e\n",local_1a8,local_1a0);
                                uVar4 = ref_geom_cell_tuv(local_1c0,local_a8[2],local_a8,2,
                                                          &local_1a8,&local_1c4);
                                if (uVar4 == 0) {
                                  printf("21uv %.18e %.18e\n",local_1a8,local_1a0);
                                  iVar1 = local_1b0->node_per;
                                  uVar5 = (ulong)iVar1;
                                  if (0 < (long)uVar5) {
                                    uVar6 = 0;
                                    do {
                                      if (local_a8[uVar6] == new_node) {
                                        local_a8[uVar6] = local_1b4;
                                      }
                                      uVar6 = uVar6 + 1;
                                    } while (uVar6 < uVar5);
                                    if (0 < iVar1) {
                                      uVar6 = 0;
                                      do {
                                        if (local_118[uVar6] == node0) {
                                          local_118[uVar6] = new_node;
                                        }
                                        uVar6 = uVar6 + 1;
                                      } while (uVar6 < uVar5);
                                    }
                                  }
                                  uVar4 = ref_geom_cell_tuv(local_1c0,local_118[0],local_118,2,
                                                            &local_1a8,&local_1c4);
                                  if (uVar4 == 0) {
                                    printf("30uv %.18e %.18e\n",local_1a8,local_1a0);
                                    uVar4 = ref_geom_cell_tuv(local_1c0,local_118[1],local_118,2,
                                                              &local_1a8,&local_1c4);
                                    if (uVar4 == 0) {
                                      printf("30uv %.18e %.18e\n",local_1a8,local_1a0);
                                      uVar4 = ref_geom_cell_tuv(local_1c0,local_118[2],local_118,2,
                                                                &local_1a8,&local_1c4);
                                      if (uVar4 == 0) {
                                        printf("30uv %.18e %.18e\n",local_1a8,local_1a0);
                                        iVar1 = local_1b0->node_per;
                                        uVar5 = (ulong)iVar1;
                                        if (0 < (long)uVar5) {
                                          uVar6 = 0;
                                          do {
                                            if (local_118[uVar6] == new_node) {
                                              local_118[uVar6] = node0;
                                            }
                                            uVar6 = uVar6 + 1;
                                          } while (uVar6 < uVar5);
                                          if (0 < iVar1) {
                                            uVar6 = 0;
                                            do {
                                              if (local_118[uVar6] == local_1b4) {
                                                local_118[uVar6] = new_node;
                                              }
                                              uVar6 = uVar6 + 1;
                                            } while (uVar6 < uVar5);
                                          }
                                        }
                                        uVar4 = ref_geom_cell_tuv(local_1c0,local_118[0],local_118,2
                                                                  ,&local_1a8,&local_1c4);
                                        if (uVar4 == 0) {
                                          printf("31uv %.18e %.18e\n",local_1a8,local_1a0);
                                          uVar4 = ref_geom_cell_tuv(local_1c0,local_118[1],local_118
                                                                    ,2,&local_1a8,&local_1c4);
                                          if (uVar4 == 0) {
                                            printf("31uv %.18e %.18e\n",local_1a8,local_1a0);
                                            uVar4 = ref_geom_cell_tuv(local_1c0,local_118[2],
                                                                      local_118,2,&local_1a8,
                                                                      &local_1c4);
                                            if (uVar4 == 0) {
                                              printf("31uv %.18e %.18e\n",local_1a8,local_1a0);
                                              iVar1 = local_1b0->node_per;
                                              if ((long)iVar1 < 1) {
                                                return 0;
                                              }
                                              uVar5 = 0;
                                              do {
                                                if (local_118[uVar5] == new_node) {
                                                  local_118[uVar5] = local_1b4;
                                                }
                                                uVar5 = uVar5 + 1;
                                              } while (uVar5 < (ulong)(long)iVar1);
                                              return 0;
                                            }
                                            pcVar8 = "cell uv0";
                                            uVar7 = 0x448;
                                          }
                                          else {
                                            pcVar8 = "cell uv0";
                                            uVar7 = 0x445;
                                          }
                                        }
                                        else {
                                          pcVar8 = "cell uv0";
                                          uVar7 = 0x442;
                                        }
                                      }
                                      else {
                                        pcVar8 = "cell uv0";
                                        uVar7 = 0x43b;
                                      }
                                    }
                                    else {
                                      pcVar8 = "cell uv0";
                                      uVar7 = 0x438;
                                    }
                                  }
                                  else {
                                    pcVar8 = "cell uv0";
                                    uVar7 = 0x435;
                                  }
                                }
                                else {
                                  pcVar8 = "cell uv0";
                                  uVar7 = 0x42d;
                                }
                              }
                              else {
                                pcVar8 = "cell uv0";
                                uVar7 = 0x42a;
                              }
                            }
                            else {
                              pcVar8 = "cell uv0";
                              uVar7 = 0x427;
                            }
                          }
                          else {
                            pcVar8 = "cell uv0";
                            uVar7 = 0x420;
                          }
                        }
                        else {
                          pcVar8 = "cell uv0";
                          uVar7 = 0x41d;
                        }
                      }
                      else {
                        pcVar8 = "cell uv0";
                        uVar7 = 0x41a;
                      }
                    }
                    else {
                      pcVar8 = "uv area 3 node 1";
                      uVar7 = 0x40b;
                    }
                  }
                  else {
                    pcVar8 = "uv area 3 node 0";
                    uVar7 = 0x405;
                  }
                }
                else {
                  pcVar8 = "uv area 2 node 0";
                  uVar7 = 0x3f8;
                }
              }
              else {
                pcVar8 = "uv area 3";
                uVar7 = 0x3f3;
              }
            }
            else {
              pcVar8 = "uv area 2";
              uVar7 = 0x3f1;
            }
          }
          else {
            pcVar8 = "cell nodes";
            uVar7 = 0x3ef;
          }
        }
        else {
          pcVar8 = "cell nodes";
          uVar7 = 0x3ee;
        }
      }
      else {
        pcVar8 = "list";
        uVar7 = 0x3ec;
      }
    }
    else {
      pcVar8 = "uv area sign";
      uVar7 = 0x3ea;
    }
  }
  else {
    pcVar8 = "unique face id";
    uVar7 = 1000;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar7,
         "ref_geom_between_face_area",(ulong)uVar4,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_between_face_area(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              const char *msg) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nodes2[REF_CELL_MAX_SIZE_PER];
  REF_INT nodes3[REF_CELL_MAX_SIZE_PER];
  REF_INT type, id, node;
  REF_INT ncell, cells[2];
  REF_DBL uv_area2, uv_area3, uv_area_sign;
  REF_DBL uv_area20, uv_area21;
  REF_DBL uv_area30, uv_area31;

  type = REF_GEOM_FACE;
  RSS(ref_geom_unique_id(ref_geom, new_node, type, &id), "unique face id");

  RSS(ref_geom_uv_area_sign(ref_grid, id, &uv_area_sign), "uv area sign");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");
  RSS(ref_cell_nodes(ref_cell, cells[0], nodes2), "cell nodes");
  RSS(ref_cell_nodes(ref_cell, cells[1], nodes3), "cell nodes");

  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area2), "uv area 2");
  uv_area2 *= uv_area_sign;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area3), "uv area 3");
  uv_area3 *= uv_area_sign;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area20), "uv area 2 node 0");
  uv_area20 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area21), "uv area 2 node 1");
  uv_area21 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node1;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area30), "uv area 3 node 0");
  uv_area30 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area31), "uv area 3 node 1");
  uv_area31 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node1;

  if (uv_area2 <= 1e-20 || uv_area3 <= 1e-20 || uv_area20 <= 0 ||
      uv_area21 <= 0 || uv_area30 <= 0 || uv_area31 <= 0) {
    REF_DBL uv[2];
    REF_DBL u0 = 0.0, v0 = 0.0;
    REF_INT sense;
    printf("%s orig uv area %e %e new %e %e %e %e\n", msg, uv_area2, uv_area3,
           uv_area20, uv_area21, uv_area30, uv_area31);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node1;
  }

  return REF_SUCCESS;
}